

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.cc
# Opt level: O0

void __thiscall Dir::Dir(Dir *this,string *path)

{
  char *__name;
  DIR *pDVar1;
  runtime_error *this_00;
  string *in_RSI;
  string *in_RDI;
  int *in_stack_00000130;
  char (*in_stack_00000138) [2];
  char (*in_stack_00000140) [85];
  char (*in_stack_00000148) [39];
  string local_40 [64];
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  __name = (char *)std::__cxx11::string::c_str();
  pDVar1 = opendir(__name);
  *(DIR **)(in_RDI + 0x20) = pDVar1;
  if (*(long *)(in_RDI + 0x20) == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    util::str<char[39],char[85],char[2],int>
              (in_stack_00000148,in_stack_00000140,in_stack_00000138,in_stack_00000130);
    std::runtime_error::runtime_error(this_00,local_40);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

Dir::Dir(const std::string& path)
    : path_(path) {
  dir_ = opendir(path.c_str());
  ASSERT(dir_ != nullptr);
}